

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_sectors.cxx
# Opt level: O0

void __thiscall
read_sector_v13::operator()(read_sector_v13 *this,sector_data **_sector,xr_reader *r)

{
  sector_data *this_00;
  size_t sVar1;
  size_t size;
  sector_data *sector;
  xr_reader *r_local;
  sector_data **_sector_local;
  read_sector_v13 *this_local;
  
  this_00 = (sector_data *)operator_new(0x20);
  xray_re::sector_data::sector_data(this_00);
  *_sector = this_00;
  sVar1 = xray_re::xr_reader::r_chunk<unsigned_int>(r,2,(uint *)this_00);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                  ,0x22,"void read_sector_v13::operator()(sector_data *&, xr_reader &) const");
  }
  sVar1 = xray_re::xr_reader::find_chunk(r,1);
  if (sVar1 != 0 && (sVar1 & 1) != 0) {
    __assert_fail("size == 0 || (size % sizeof(uint16_t) == 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                  ,0x24,"void read_sector_v13::operator()(sector_data *&, xr_reader &) const");
  }
  xray_re::xr_reader::r_seq<std::vector<unsigned_short,std::allocator<unsigned_short>>>
            (r,sVar1 >> 1,&this_00->portals);
  return;
}

Assistant:

void operator()(sector_data*& _sector, xr_reader& r) const {
	sector_data* sector = new sector_data;
	_sector = sector;
	if (!r.r_chunk(FSP_ROOT, sector->root))
		xr_not_expected();
	size_t size = r.find_chunk(FSP_PORTALS);
	xr_assert(size == 0 || (size % sizeof(uint16_t) == 0));
	r.r_seq(size/sizeof(uint16_t), sector->portals);
}